

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

bool __thiscall
clipp::parser::try_match_full<clipp::detail::select_flags>
          (parser *this,arg_string *arg,select_flags *select)

{
  pointer pcVar1;
  match_t match;
  match_t local_180;
  scoped_dfs_traverser local_c0;
  
  detail::scoped_dfs_traverser::scoped_dfs_traverser(&local_c0,&this->pos_);
  detail::full_match<clipp::detail::select_flags>(&local_180,&local_c0,arg,select);
  std::
  _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  ::~_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                  *)&local_c0.scopes_);
  if (local_c0.posAfterLastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.posAfterLastMatch_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.posAfterLastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.posAfterLastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.lastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.lastMatch_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.lastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.lastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.pos_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.pos_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.pos_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pcVar1 = local_180.pos_.pos_.stack_.
           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_180.pos_.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_180.pos_.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    add_match(this,&local_180);
  }
  std::
  _Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
  ::~_Deque_base((_Deque_base<clipp::group::depth_first_traverser::memento,_std::allocator<clipp::group::depth_first_traverser::memento>_>
                  *)&local_180.pos_.scopes_);
  if (local_180.pos_.posAfterLastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.pos_.posAfterLastMatch_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.pos_.posAfterLastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.pos_.posAfterLastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_180.pos_.lastMatch_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.pos_.lastMatch_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.pos_.lastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.pos_.lastMatch_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_180.pos_.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_180.pos_.pos_.stack_.
                    super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.pos_.pos_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.pos_.pos_.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.str_._M_dataplus._M_p != &local_180.str_.field_2) {
    operator_delete(local_180.str_._M_dataplus._M_p,local_180.str_.field_2._M_allocated_capacity + 1
                   );
  }
  return pcVar1 != local_180.pos_.pos_.stack_.
                   super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool try_match_full(const arg_string& arg, const ParamSelector& select)
    {
        auto match = detail::full_match(pos_, arg, select);
        if(!match) return false;
        add_match(match);
        return true;
    }